

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimizer.h
# Opt level: O0

bool mocker::runOptPasses<mocker::MergeBlocks>(Module *module)

{
  bool bVar1;
  bool bVar2;
  FuncsMap *pFVar3;
  reference ppVar4;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mocker::ir::FunctionModule>
  *func_1;
  iterator __end2_1;
  iterator __begin2_1;
  FuncsMap *__range2_1;
  bool res;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mocker::ir::FunctionModule>
  *func;
  iterator __end2;
  iterator __begin2;
  FuncsMap *__range2;
  Module *module_local;
  
  pFVar3 = ir::Module::getFuncs_abi_cxx11_(module);
  __end2 = std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mocker::ir::FunctionModule,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mocker::ir::FunctionModule>_>_>
           ::begin(pFVar3);
  func = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mocker::ir::FunctionModule>
          *)std::
            unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mocker::ir::FunctionModule,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mocker::ir::FunctionModule>_>_>
            ::end(pFVar3);
  while( true ) {
    bVar1 = std::__detail::operator!=
                      (&__end2.
                        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mocker::ir::FunctionModule>,_true>
                       ,(_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mocker::ir::FunctionModule>,_true>
                         *)&func);
    if (!bVar1) break;
    ppVar4 = std::__detail::
             _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mocker::ir::FunctionModule>,_false,_true>
             ::operator*(&__end2);
    ir::FunctionModule::buildContext(&ppVar4->second);
    std::__detail::
    _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mocker::ir::FunctionModule>,_false,_true>
    ::operator++(&__end2);
  }
  bVar1 = detail::runOptPassImpl<mocker::MergeBlocks>(module,(FuncPass *)0x0);
  pFVar3 = ir::Module::getFuncs_abi_cxx11_(module);
  __end2_1 = std::
             unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mocker::ir::FunctionModule,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mocker::ir::FunctionModule>_>_>
             ::begin(pFVar3);
  func_1 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mocker::ir::FunctionModule>
            *)std::
              unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mocker::ir::FunctionModule,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mocker::ir::FunctionModule>_>_>
              ::end(pFVar3);
  while( true ) {
    bVar2 = std::__detail::operator!=
                      (&__end2_1.
                        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mocker::ir::FunctionModule>,_true>
                       ,(_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mocker::ir::FunctionModule>,_true>
                         *)&func_1);
    if (!bVar2) break;
    ppVar4 = std::__detail::
             _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mocker::ir::FunctionModule>,_false,_true>
             ::operator*(&__end2_1);
    ir::FunctionModule::buildContext(&ppVar4->second);
    std::__detail::
    _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mocker::ir::FunctionModule>,_false,_true>
    ::operator++(&__end2_1);
  }
  ir::verifyModule(module);
  return bVar1;
}

Assistant:

bool runOptPasses(ir::Module &module, Args &&... args) {
  for (auto &func : module.getFuncs())
    func.second.buildContext();
  auto res = detail::runOptPassImpl<Pass>(module, (Pass *)(nullptr),
                                          std::forward<Args>(args)...);
  for (auto &func : module.getFuncs())
    func.second.buildContext();
  ir::verifyModule(module);
  return res;
}